

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O2

void __thiscall indk::Position::Position(Position *this,Position *P)

{
  uint uVar1;
  uint uVar2;
  float *pfVar3;
  float *pfVar4;
  ulong uVar5;
  float fVar6;
  
  this->Xm = P->Xm;
  uVar1 = P->DimensionsCount;
  this->DimensionsCount = uVar1;
  pfVar4 = (float *)operator_new__((ulong)uVar1 * 4);
  this->X = pfVar4;
  uVar2 = P->DimensionsCount;
  pfVar3 = P->X;
  for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
    fVar6 = -1.0;
    if (uVar5 < uVar2) {
      fVar6 = pfVar3[uVar5];
    }
    pfVar4[uVar5] = fVar6;
  }
  return;
}

Assistant:

indk::Position::Position(const indk::Position &P) {
    Xm = P.getXm();
    DimensionsCount = P.getDimensionsCount();
    X = new float[DimensionsCount];
    for (unsigned int i = 0; i < DimensionsCount; i++) X[i] = P.getPositionValue(i);
}